

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O2

value value_copy(value v)

{
  value __dest;
  void *pvVar1;
  size_t bytes;
  
  if (v == (value)0x28 || v == (value)0x0) {
    bytes = 0;
  }
  else {
    bytes = *(size_t *)((long)v + -0x20);
  }
  __dest = value_alloc(bytes);
  if (__dest != (value)0x0) {
    pvVar1 = memcpy(__dest,v,bytes);
    return pvVar1;
  }
  return (value)0x0;
}

Assistant:

value value_copy(value v)
{
	size_t size = value_size(v);

	value copy = value_alloc(size);

	if (copy == NULL)
	{
		return NULL;
	}

	memcpy(copy, value_data(v), size);

	return copy;
}